

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Householder.h
# Opt level: O1

void __thiscall
Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,-1,-1,false>>::
applyHouseholderOnTheLeft<Eigen::VectorBlock<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,_1>>
          (MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,_1,_1,false>> *this,
          VectorBlock<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1> *essential
          ,Scalar *tau,Scalar *workspace)

{
  double dVar1;
  double *pdVar2;
  long lVar3;
  char *pcVar4;
  XprTypeNested *pXVar5;
  double *pdVar6;
  undefined8 *puVar7;
  long lVar8;
  variable_if_dynamic<long,__1> *pvVar9;
  undefined8 *puVar10;
  Index inner;
  long lVar11;
  ulong uVar12;
  Index row;
  ulong uVar13;
  ulong uVar14;
  Index size;
  byte bVar15;
  double dVar16;
  CoeffReturnType CVar17;
  Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false> bottom;
  sub_assign_op<double,_double> local_199;
  undefined8 *local_198;
  double *local_190;
  Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false> local_188;
  undefined1 local_120 [40];
  variable_if_dynamic<long,__1> local_f8;
  undefined8 local_f0 [6];
  PointerType local_c0;
  variable_if_dynamic<long,__1> local_b8;
  variable_if_dynamic<long,__1> local_b0;
  variable_if_dynamic<long,__1> local_a8 [4];
  variable_if_dynamic<long,__1> local_88;
  PointerType local_58;
  PointerType local_48;
  XprTypeNested local_38;
  
  bVar15 = 0;
  lVar3 = *(long *)(this + 8);
  dVar16 = *tau;
  if (lVar3 == 1) {
    lVar3 = *(long *)(this + 0x10);
    if (lVar3 < 0) {
      pcVar4 = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 0, 3, 3>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 0, 3, 3>]"
      ;
LAB_0013c2c1:
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/CwiseNullaryOp.h"
                    ,0x4a,pcVar4);
    }
    dVar16 = 1.0 - dVar16;
    pdVar2 = *(double **)this;
    if (((ulong)pdVar2 & 7) == 0) {
      if (lVar3 != 0) {
        uVar12 = (ulong)((uint)((ulong)pdVar2 >> 3) & 1);
        if (uVar12 != 0) {
          uVar12 = 1;
        }
        lVar8 = 0;
        pdVar6 = pdVar2;
        do {
          if (0 < (long)uVar12) {
            pdVar2[lVar8 * 3] = pdVar2[lVar8 * 3] * dVar16;
          }
          uVar14 = 1 - uVar12 & 0xfffffffffffffffe;
          lVar11 = uVar14 + uVar12;
          uVar13 = uVar12;
          if (0 < (long)uVar14) {
            do {
              dVar1 = (pdVar6 + uVar13)[1];
              pdVar6[uVar13] = pdVar6[uVar13] * dVar16;
              (pdVar6 + uVar13)[1] = dVar1 * dVar16;
              uVar13 = uVar13 + 2;
            } while ((long)uVar13 < lVar11);
          }
          for (; lVar11 < 1; lVar11 = lVar11 + 1) {
            pdVar6[lVar11] = pdVar6[lVar11] * dVar16;
          }
          uVar12 = (uVar12 + 1) - ((uVar12 - ((long)(uVar12 + 1) >> 0x3f)) + 1 & 0xfffffffffffffffe)
          ;
          if (1 < (long)uVar12) {
            uVar12 = 1;
          }
          lVar8 = lVar8 + 1;
          pdVar6 = pdVar6 + 3;
        } while (lVar8 != lVar3);
      }
    }
    else {
      for (; lVar3 != 0; lVar3 = lVar3 + -1) {
        *pdVar2 = *pdVar2 * dVar16;
        pdVar2 = pdVar2 + 3;
      }
    }
  }
  else if ((dVar16 != 0.0) || (NAN(dVar16))) {
    uVar12 = *(ulong *)(this + 0x10);
    if ((long)uVar12 < 0) {
      __assert_fail("vecSize >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/MapBase.h"
                    ,0xa6,
                    "Eigen::MapBase<Eigen::Map<Eigen::Matrix<double, 1, -1, 1, 1, 3>>, 0>::MapBase(PointerType, Index) [Derived = Eigen::Map<Eigen::Matrix<double, 1, -1, 1, 1, 3>>, Level = 0]"
                   );
    }
    local_188.
    super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_0>
    .m_rows.m_value = lVar3 - 1;
    local_188.
    super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_0>
    .m_data = (PointerType)(*(long *)this + 8);
    local_188.
    super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_0>
    .m_cols.m_value = uVar12;
    if ((long)(uVar12 | local_188.
                        super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
                        .
                        super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_true>
                        .
                        super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_1>
                        .
                        super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_0>
                        .m_rows.m_value) < 0 && *(long *)this != 0) {
      pcVar4 = 
      "Eigen::MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double, 3, 3>>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Block<Eigen::Matrix<double, 3, 3>>>, Level = 0]"
      ;
    }
    else {
      local_188.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_true>
      .m_xpr.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false,_true>.m_outerStride
           = *(Index *)(this + 0x30);
      local_188.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_true>
      .m_xpr.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false,_true>.m_startRow.
      m_value = *(long *)(this + 0x20);
      local_188.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_true>
      .m_xpr.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false,_true>.m_startCol.
      m_value = *(long *)(this + 0x28);
      local_188.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_true>
      .m_xpr.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,_0>.m_cols.
      m_value = *(long *)(this + 0x10);
      local_188.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_true>
      .m_xpr.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false,_true>.m_xpr =
           *(XprTypeNested *)(this + 0x18);
      local_188.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_true>
      .m_xpr.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,_0>.m_data =
           *(PointerType *)this;
      local_188.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_true>
      .m_xpr.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,_0>.m_rows.
      m_value = *(long *)(this + 8);
      local_188.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_true>
      .m_startRow.m_value = 1;
      local_188.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_true>
      .m_startCol.m_value = 0;
      local_188.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_true>
      .m_outerStride = 3;
      if (lVar3 < 1) {
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Block.h"
                      ,0x93,
                      "Eigen::Block<Eigen::Block<Eigen::Matrix<double, 3, 3>>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Block<Eigen::Matrix<double, 3, 3>>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                     );
      }
      local_120._8_8_ =
           (essential->
           super_Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>
           ).
           super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false,_Eigen::Dense>
           .
           super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false,_true>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,_1>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,_0>
           .m_rows.m_value;
      local_190 = tau;
      if (local_120._8_8_ !=
          local_188.
          super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_0>
          .m_rows.m_value) {
        __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Product.h"
                      ,0x62,
                      "Eigen::Product<Eigen::Transpose<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 3, 3>, 3, 1, true>, -1, 1>>, Eigen::Block<Eigen::Block<Eigen::Matrix<double, 3, 3>>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 3, 3>, 3, 1, true>, -1, 1>>, Rhs = Eigen::Block<Eigen::Block<Eigen::Matrix<double, 3, 3>>>, Option = 0]"
                     );
      }
      local_198 = (undefined8 *)
                  &(essential->
                   super_Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>
                   ).
                   super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,_0>
                   .field_0x10;
      local_120._0_8_ =
           (essential->
           super_Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>
           ).
           super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false,_Eigen::Dense>
           .
           super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false,_true>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,_1>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,_0>
           .m_data;
      puVar7 = local_198;
      puVar10 = (undefined8 *)(local_120 + 0x10);
      for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
        *puVar10 = *puVar7;
        puVar7 = puVar7 + 1;
        puVar10 = puVar10 + 1;
      }
      local_c0 = local_188.
                 super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_0>
                 .m_data;
      local_b8.m_value =
           local_188.
           super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
           .
           super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_true>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_1>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_0>
           .m_rows.m_value;
      local_b0.m_value = uVar12;
      pXVar5 = &local_188.
                super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
                .
                super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_true>
                .m_xpr;
      pvVar9 = local_a8;
      for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
        pvVar9->m_value =
             (long)(pXVar5->
                   super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false,_Eigen::Dense>
                   ).
                   super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false,_true>.
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,_0>
                   .m_data;
        pXVar5 = (XprTypeNested *)
                 &(pXVar5->
                  super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false,_Eigen::Dense>
                  ).super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false,_true>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,_0>
                  .m_rows;
        pvVar9 = pvVar9 + 1;
      }
      local_58 = (PointerType)local_120._0_8_;
      local_48 = local_188.
                 super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_0>
                 .m_data;
      local_38 = (XprTypeNested)local_120._8_8_;
      if (uVar12 != 0) {
        uVar13 = 0;
        do {
          CVar17 = internal::
                   product_evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_-1,_1,_false>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_-1,_-1,_false>,_-1,_-1,_false>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                   ::coeff((product_evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                            *)local_120,uVar13);
          workspace[uVar13] = CVar17;
          uVar13 = uVar13 + 1;
        } while (uVar12 != uVar13);
      }
      pdVar2 = *(double **)this;
      uVar13 = *(ulong *)(this + 0x10);
      if (-1 < (long)uVar13 || pdVar2 == (double *)0x0) {
        if (0 < *(long *)(this + 8)) {
          if (uVar12 != uVar13) {
            __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                          "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/AssignEvaluator.h"
                          ,0x2f2,
                          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<double, 1, -1, 1, 1, 3>>, SrcXprType = Eigen::Block<Eigen::Block<Eigen::Matrix<double, 3, 3>>, 1>, Functor = Eigen::internal::add_assign_op<double, double>]"
                         );
          }
          if (uVar12 != 0) {
            uVar14 = 0;
            pdVar6 = pdVar2;
            do {
              workspace[uVar14] = *pdVar6 + workspace[uVar14];
              uVar14 = uVar14 + 1;
              pdVar6 = pdVar6 + 3;
            } while (uVar12 != uVar14);
          }
          if (0 < *(long *)(this + 8)) {
            if (0 < (long)uVar13) {
              dVar16 = *local_190;
              uVar14 = 0;
              do {
                *pdVar2 = *pdVar2 - workspace[uVar14] * dVar16;
                uVar14 = uVar14 + 1;
                pdVar2 = pdVar2 + 3;
              } while (uVar13 != uVar14);
            }
            local_f8.m_value =
                 (essential->
                 super_Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>
                 ).
                 super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,_0>
                 .m_rows.m_value;
            if (-1 < local_f8.m_value) {
              if ((local_188.
                   super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_0>
                   .m_rows.m_value == local_f8.m_value) &&
                 (local_188.
                  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_true>
                  .
                  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_0>
                  .m_cols.m_value == uVar12)) {
                local_120._32_8_ =
                     (essential->
                     super_Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>
                     ).
                     super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false,_true>
                     .
                     super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,_1>
                     .
                     super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,_0>
                     .m_data;
                local_120._24_8_ = *local_190;
                puVar7 = local_198;
                puVar10 = local_f0;
                for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
                  *puVar10 = *puVar7;
                  puVar7 = puVar7 + (ulong)bVar15 * -2 + 1;
                  puVar10 = puVar10 + (ulong)bVar15 * -2 + 1;
                }
                local_120._8_8_ = local_f8.m_value;
                local_a8[2].m_value = (long)workspace;
                local_88.m_value = uVar12;
                internal::
                call_dense_assignment_loop<Eigen::Block<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,_1,_1,false>,_1,_1,false>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,3,1>const>const,Eigen::Block<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,_1,1,false>const>,Eigen::Map<Eigen::Matrix<double,1,_1,1,1,3>,0,Eigen::Stride<0,0>>,1>,Eigen::internal::sub_assign_op<double,double>>
                          (&local_188,
                           (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>
                            *)local_120,&local_199);
                return;
              }
              __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                            "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/ProductEvaluators.h"
                            ,0xb0,
                            "static void Eigen::internal::Assignment<Eigen::Block<Eigen::Block<Eigen::Matrix<double, 3, 3>>>, Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>, const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 3, 3>, 3, 1, true>, -1, 1>>, Eigen::Map<Eigen::Matrix<double, 1, -1, 1, 1, 3>>>, Eigen::internal::sub_assign_op<double, double>>::run(DstXprType &, const SrcXprType &, const internal::sub_assign_op<Scalar, Scalar> &) [DstXprType = Eigen::Block<Eigen::Block<Eigen::Matrix<double, 3, 3>>>, SrcXprType = Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>, const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 3, 3>, 3, 1, true>, -1, 1>>, Eigen::Map<Eigen::Matrix<double, 1, -1, 1, 1, 3>>>, Functor = Eigen::internal::sub_assign_op<double, double>, Kind = Eigen::internal::Dense2Dense, EnableIf = void]"
                           );
            }
            pcVar4 = 
            "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1, 0, 3, 1>]"
            ;
            goto LAB_0013c2c1;
          }
        }
        __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Block.h"
                      ,0x7a,
                      "Eigen::Block<Eigen::Block<Eigen::Matrix<double, 3, 3>>, 1>::Block(XprType &, Index) [XprType = Eigen::Block<Eigen::Matrix<double, 3, 3>>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
                     );
      }
      pcVar4 = 
      "Eigen::MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double, 3, 3>>, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Block<Eigen::Matrix<double, 3, 3>>, 1>, Level = 0]"
      ;
    }
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/MapBase.h"
                  ,0xb2,pcVar4);
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
void MatrixBase<Derived>::applyHouseholderOnTheLeft(
  const EssentialPart& essential,
  const Scalar& tau,
  Scalar* workspace)
{
  if(rows() == 1)
  {
    *this *= Scalar(1)-tau;
  }
  else if(tau!=Scalar(0))
  {
    Map<typename internal::plain_row_type<PlainObject>::type> tmp(workspace,cols());
    Block<Derived, EssentialPart::SizeAtCompileTime, Derived::ColsAtCompileTime> bottom(derived(), 1, 0, rows()-1, cols());
    tmp.noalias() = essential.adjoint() * bottom;
    tmp += this->row(0);
    this->row(0) -= tau * tmp;
    bottom.noalias() -= tau * essential * tmp;
  }
}